

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFPageDocumentHelper::flattenAnnotationsForPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *page,QPDFObjectHandle *resources,
          QPDFAcroFormDocumentHelper *afdh,int required_flags,int forbidden_flags)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  QPDF *this_00;
  string *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar4;
  bool bVar5;
  int iVar6;
  longlong lVar7;
  QPDFObjGen og;
  pointer pQVar8;
  pointer this_02;
  string name;
  string content;
  QPDFObjectHandle as;
  int next_fx;
  QPDFObjectHandle old_annots;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle rotate_obj;
  string new_content;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annots;
  QPDFAnnotationObjectHelper local_210;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [24];
  QPDFObjectHandle local_188;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  QPDFObjectHandle local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  QPDFObjectHandle local_f8;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_e8;
  QPDFPageDocumentHelper *local_d0;
  QPDFPageObjectHelper *local_c8;
  undefined **local_c0;
  QPDFAcroFormDocumentHelper *local_b8;
  QPDFAnnotationObjectHelper *local_b0;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  undefined1 local_78 [24];
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_178._16_8_ = resources;
  local_178._24_4_ = required_flags;
  local_178._28_4_ = forbidden_flags;
  local_b8 = afdh;
  bVar4 = QPDFAcroFormDocumentHelper::getNeedAppearances(afdh);
  local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  QPDFPageObjectHelper::getAnnotations(&local_e8,page,(string *)&local_210);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
    operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_138._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_158._16_8_ = 0;
  local_158._24_8_ = 0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p =
       (pointer)(page->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8._M_string_length =
       (size_type)
       (page->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->
           _M_use_count + 1;
    }
  }
  local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/Rotate","");
  QPDFObjectHandle::getKey(&local_128,&local_1d8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
    operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length);
  }
  bVar5 = QPDFObjectHandle::isInteger(&local_128);
  local_1a0._16_4_ = 0;
  if ((bVar5) && (lVar7 = QPDFObjectHandle::getIntValue(&local_128), lVar7 != 0)) {
    local_1a0._16_4_ = QPDFObjectHandle::getIntValueAsInt(&local_128);
  }
  local_1a0._20_4_ = 1;
  local_b0 = local_e8.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pQVar8 = local_e8.
           super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_e8.
      super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar2 = &local_1d8.field_2;
    local_c0 = &PTR__QPDFObjectHelper_002edce8;
    this_02 = local_e8.
              super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_d0 = this;
    local_c8 = page;
    do {
      local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/N","");
      local_1d8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
      QPDFAnnotationObjectHelper::getAppearanceStream
                ((QPDFAnnotationObjectHelper *)local_1a0,(string *)this_02,(string *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
        operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_((string *)&local_210,this_02);
      iVar6 = std::__cxx11::string::compare((char *)&local_210);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
        operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (bVar4 && iVar6 == 0) {
LAB_001d1808:
        local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)
             (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
           ) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)
                     ((long)&((local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 8);
            *p_Var1 = *p_Var1 + 1;
            UNLOCK();
          }
          else {
            p_Var1 = (_Atomic_word *)
                     ((long)&((local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 8);
            *p_Var1 = *p_Var1 + 1;
          }
        }
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
        emplace_back<QPDFObjectHandle>
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_158 + 0x10)
                   ,(QPDFObjectHandle *)&local_210);
        if (local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      else {
        bVar5 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_1a0);
        if (bVar5) {
          if (iVar6 == 0) {
            local_60 = (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_58._M_pi =
                 (this_02->super_QPDFObjectHelper).super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
              }
            }
            local_50 = (this_02->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_48._M_pi =
                 (this_02->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
              }
            }
            local_78._16_8_ = &PTR__QPDFAnnotationObjectHelper_002eb050;
            local_40 = (this_02->m).
                       super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
            local_38 = (this_02->m).
                       super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_38->_M_use_count = local_38->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_38->_M_use_count = local_38->_M_use_count + 1;
              }
            }
            QPDFAcroFormDocumentHelper::getFieldForAnnotation
                      ((QPDFFormFieldObjectHelper *)&local_210,local_b8,
                       (QPDFAnnotationObjectHelper *)(local_78 + 0x10));
            QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                      ((QPDFAnnotationObjectHelper *)(local_78 + 0x10));
            QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1b8);
            local_1d8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/Resources","");
            QPDFObjectHandle::getKey(&local_188,(string *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != paVar2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
            }
            bVar5 = QPDFObjectHandle::isIndirect(&local_188);
            if (bVar5) {
              QPDFObjectHandle::getDict((QPDFObjectHandle *)local_1b8);
              local_1d8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/Resources","");
              QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)local_158);
              QPDFObjectHandle::replaceKey
                        ((QPDFObjectHandle *)local_1b8,&local_1d8,(QPDFObjectHandle *)local_158);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
              }
              QPDFObjectHandle::getDict((QPDFObjectHandle *)local_158);
              local_1d8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/Resources","");
              QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b8,(string *)local_158);
              this_01._M_pi =
                   local_188.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              local_188.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
              local_188.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_1b8._0_8_;
              local_1b8._0_8_ = (element_type *)0x0;
              local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if ((this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
              }
            }
            QPDFFormFieldObjectHelper::getDefaultResources((QPDFFormFieldObjectHelper *)local_78);
            QPDFObjectHandle::mergeResources
                      (&local_188,(QPDFObjectHandle *)local_78,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)0x0);
            if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
            }
            if (local_188.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_188.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)&local_210);
          }
          local_1d8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/Fxo","");
          QPDFObjectHandle::getUniqueResourceName
                    ((string *)&local_210,(QPDFObjectHandle *)local_178._16_8_,&local_1d8,
                     (int *)(local_1a0 + 0x14),
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          QPDFAnnotationObjectHelper::getPageContentForAppearance
                    (&local_1d8,this_02,(string *)&local_210,local_1a0._16_4_,local_178._24_4_,
                     local_178._28_4_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            operator____qpdf((char *)&local_88,0x267353);
            QPDFObjectHandle::mergeResources
                      ((QPDFObjectHandle *)local_178._16_8_,&local_88,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                        *)0x0);
            if (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_88.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            local_188.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"/XObject","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b8,(string *)local_178._16_8_);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_1b8,(string *)&local_210,
                       (QPDFObjectHandle *)local_1a0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
            }
            if (local_188.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_178) {
              operator_delete(local_188.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (ulong)(local_178._0_8_ + 1));
            }
            local_1a0._20_4_ = local_1a0._20_4_ + 1;
          }
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_1d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
            operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
        else {
          QPDFAnnotationObjectHelper::getAppearanceDictionary(&local_210);
          bVar5 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_210);
          if (local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if (bVar5) goto LAB_001d1808;
        }
      }
      if ((element_type *)local_1a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
      }
      this_02 = this_02 + 1;
      pQVar8 = local_e8.
               super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this = local_d0;
      page = local_c8;
    } while (this_02 != local_b0);
  }
  if ((long)(local_158._24_8_ - local_158._16_8_) >> 4 !=
      ((long)pQVar8 -
       (long)local_e8.
             super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
    local_1d8._M_dataplus._M_p =
         (pointer)(page->super_QPDFObjectHelper).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1d8._M_string_length =
         (size_type)
         (page->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)->
             _M_use_count + 1;
      }
    }
    if (local_158._16_8_ == local_158._24_8_) {
      local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/Annots","");
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_1d8,(string *)&local_210);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
        operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
    }
    else {
      local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/Annots","");
      QPDFObjectHandle::getKey(&local_188,&local_1d8);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
        operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFObjectHandle::newArray
                ((QPDFObjectHandle *)local_1a0,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_158 + 0x10));
      bVar4 = QPDFObjectHandle::isIndirect(&local_188);
      if (bVar4) {
        this_00 = (this->super_QPDFDocumentHelper).qpdf;
        og = QPDFObjectHandle::getObjGen(&local_188);
        local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_1a0._0_8_;
        local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_;
        if ((element_type *)local_1a0._8_8_ != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_1a0._8_8_ + 8) = *(_Atomic_word *)(local_1a0._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_1a0._8_8_ + 8) = *(_Atomic_word *)(local_1a0._8_8_ + 8) + 1;
          }
        }
        QPDF::replaceObject(this_00,og,&local_f8);
        if ((element_type *)
            local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      else {
        local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/Annots","");
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&local_1d8,(string *)&local_210,(QPDFObjectHandle *)local_1a0
                  );
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
          operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
      }
      if ((element_type *)local_1a0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
      }
      if (local_188.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    psVar3 = (string *)(this->super_QPDFDocumentHelper).qpdf;
    local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"q\n","");
    QPDF::newStream((QPDF *)&local_98,psVar3);
    QPDFPageObjectHelper::addPageContents(page,&local_98,true);
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
      operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    psVar3 = (string *)(this->super_QPDFDocumentHelper).qpdf;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "\nQ\n",&local_118);
    QPDF::newStream((QPDF *)&local_a8,psVar3);
    QPDFPageObjectHelper::addPageContents(page,&local_a8,false);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&local_210.super_QPDFObjectHelper.super_BaseHandle + 8U)) {
      operator_delete(local_210.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_210.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length);
    }
  }
  if (local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)(local_158 + 0x10));
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            (&local_e8);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotationsForPage(
    QPDFPageObjectHelper& page,
    QPDFObjectHandle& resources,
    QPDFAcroFormDocumentHelper& afdh,
    int required_flags,
    int forbidden_flags)
{
    bool need_appearances = afdh.getNeedAppearances();
    std::vector<QPDFAnnotationObjectHelper> annots = page.getAnnotations();
    std::vector<QPDFObjectHandle> new_annots;
    std::string new_content;
    int rotate = 0;
    QPDFObjectHandle rotate_obj = page.getObjectHandle().getKey("/Rotate");
    if (rotate_obj.isInteger() && rotate_obj.getIntValue()) {
        rotate = rotate_obj.getIntValueAsInt();
    }
    int next_fx = 1;
    for (auto& aoh: annots) {
        QPDFObjectHandle as = aoh.getAppearanceStream("/N");
        bool is_widget = (aoh.getSubtype() == "/Widget");
        bool process = true;
        if (need_appearances && is_widget) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper skip widget need appearances");
            process = false;
        }
        if (process && as.isStream()) {
            if (is_widget) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper merge DR");
                QPDFFormFieldObjectHelper ff = afdh.getFieldForAnnotation(aoh);
                QPDFObjectHandle as_resources = as.getDict().getKey("/Resources");
                if (as_resources.isIndirect()) {
                    QTC::TC("qpdf", "QPDFPageDocumentHelper indirect as resources");
                    as.getDict().replaceKey("/Resources", as_resources.shallowCopy());
                    as_resources = as.getDict().getKey("/Resources");
                }
                as_resources.mergeResources(ff.getDefaultResources());
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper non-widget annotation");
            }
            std::string name = resources.getUniqueResourceName("/Fxo", next_fx);
            std::string content =
                aoh.getPageContentForAppearance(name, rotate, required_flags, forbidden_flags);
            if (!content.empty()) {
                resources.mergeResources("<< /XObject << >> >>"_qpdf);
                resources.getKey("/XObject").replaceKey(name, as);
                ++next_fx;
            }
            new_content += content;
        } else if (process && !aoh.getAppearanceDictionary().isNull()) {
            // If an annotation has no selected appearance stream, just drop the annotation when
            // flattening. This can happen for unchecked checkboxes and radio buttons, popup windows
            // associated with comments that aren't visible, and other types of annotations that
            // aren't visible. Annotations that have no appearance streams at all, such as Link,
            // Popup, and Projection, should be preserved.
            QTC::TC("qpdf", "QPDFPageDocumentHelper ignore annotation with no appearance");
        } else {
            new_annots.push_back(aoh.getObjectHandle());
        }
    }
    if (new_annots.size() != annots.size()) {
        QPDFObjectHandle page_oh = page.getObjectHandle();
        if (new_annots.empty()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper remove annots");
            page_oh.removeKey("/Annots");
        } else {
            QPDFObjectHandle old_annots = page_oh.getKey("/Annots");
            QPDFObjectHandle new_annots_oh = QPDFObjectHandle::newArray(new_annots);
            if (old_annots.isIndirect()) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace indirect annots");
                this->qpdf.replaceObject(old_annots.getObjGen(), new_annots_oh);
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace direct annots");
                page_oh.replaceKey("/Annots", new_annots_oh);
            }
        }
        page.addPageContents(qpdf.newStream("q\n"), true);
        page.addPageContents(qpdf.newStream("\nQ\n" + new_content), false);
    }
}